

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framework.cpp
# Opt level: O1

void handle_terminate(void)

{
  long *plVar1;
  char *__s;
  undefined1 auVar2 [12];
  exception_ptr p;
  long local_28;
  long local_20;
  
  puts("\nuncaught exception terminate handler called!");
  fflush(_stdout);
  std::current_exception();
  if (local_28 != 0) {
    local_20 = local_28;
    std::__exception_ptr::exception_ptr::_M_addref();
    auVar2 = std::rethrow_exception((exception_ptr)&local_20);
    if (local_20 != 0) {
      std::__exception_ptr::exception_ptr::_M_release();
    }
    plVar1 = (long *)__cxa_begin_catch(auVar2._0_8_);
    if (auVar2._8_4_ == 2) {
      __s = (char *)(**(code **)(*plVar1 + 0x10))(plVar1);
      puts(__s);
      fflush(_stdout);
      __cxa_end_catch();
    }
    else {
      puts("caught an unknown exception in custom terminate handler.");
      __cxa_end_catch();
    }
  }
  if (local_28 != 0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  return;
}

Assistant:

void handle_terminate()
{
    printf( "\nuncaught exception terminate handler called!\n" );
    fflush(stdout);

    std::exception_ptr p = std::current_exception();

    if( p )
    {
        try
        {
            std::rethrow_exception( p );
        }
        catch(std::exception& ex)
        {
            printf("%s\n",ex.what());
            fflush(stdout);
        }
        catch(...)
        {
            printf("caught an unknown exception in custom terminate handler.\n");
        }
    }
}